

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundatanode_inmem.c
# Opt level: O2

SUNErrCode SUNDataNode_Destroy_InMem(SUNDataNode *node)

{
  SUNDataNodeType SVar1;
  SUNDataNode pSVar2;
  void *pvVar3;
  long *__ptr;
  SUNMemory mem;
  int iVar4;
  long lVar5;
  int64_t i;
  long lVar6;
  SUNHashMap map;
  SUNHashMap local_30;
  
  pSVar2 = *node;
  SVar1 = pSVar2->dtype;
  if (SVar1 == SUNDATANODE_LEAF) {
    mem = *(SUNMemory *)((long)pSVar2->content + 0x10);
    if (mem != (SUNMemory)0x0) {
      SUNMemoryHelper_Dealloc(*(SUNMemoryHelper *)((long)pSVar2->content + 8),mem,(void *)0x0);
    }
  }
  else if (SVar1 == SUNDATANODE_LIST) {
    pvVar3 = pSVar2->content;
    __ptr = *(long **)((long)pvVar3 + 0x30);
    if (__ptr != (long *)0x0) {
      lVar5 = 0;
      for (lVar6 = 0; lVar6 < *__ptr; lVar6 = lVar6 + 1) {
        iVar4 = (*(code *)__ptr[3])(__ptr[2] + lVar5);
        if (iVar4 != 0) goto LAB_001080d1;
        *(undefined8 *)(__ptr[2] + lVar5) = 0;
        lVar5 = lVar5 + 8;
      }
      free((void *)__ptr[2]);
      free(__ptr);
      *(undefined8 *)((long)pvVar3 + 0x30) = 0;
    }
  }
  else if (SVar1 == SUNDATANODE_OBJECT) {
    local_30 = *(SUNHashMap *)((long)pSVar2->content + 0x20);
    SUNHashMap_Destroy(&local_30);
  }
LAB_001080d1:
  sunDataNode_DestroyCommon_InMem(node);
  *node = (SUNDataNode)0x0;
  return 0;
}

Assistant:

SUNErrCode SUNDataNode_Destroy_InMem(SUNDataNode* node)
{
  SUNFunctionBegin((*node)->sunctx);

  /* Use the default queue for the memory helper */
  void* queue = NULL;

  if (BASE_MEMBER(*node, dtype) == SUNDATANODE_OBJECT)
  {
    SUNHashMap map = IMPL_MEMBER(*node, named_children);
    SUNHashMap_Destroy(&map);
  }
  else if (BASE_MEMBER(*node, dtype) == SUNDATANODE_LIST)
  {
    SUNStlVector_SUNDataNode_Destroy(&IMPL_MEMBER(*node, anon_children));
  }
  else if (BASE_MEMBER(*node, dtype) == SUNDATANODE_LEAF)
  {
    if (IMPL_MEMBER(*node, leaf_data))
    {
      SUNCheckCall(SUNMemoryHelper_Dealloc(IMPL_MEMBER(*node, mem_helper),
                                           IMPL_MEMBER(*node, leaf_data), queue));
    }
  }

  sunDataNode_DestroyCommon_InMem(node);
  *node = NULL;

  return SUN_SUCCESS;
}